

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

RK_S32 h265e_code_slice_skip_frame(void *ctx,H265eSlice *slice,RK_U8 *buf,RK_S32 len)

{
  int iVar1;
  int local_9c;
  RK_S32 i;
  RK_U32 mb_h;
  RK_U32 mb_wd;
  MppWriteCtx bitIf;
  TileInfo tile;
  H265ePps *pps;
  H265eSps *sps;
  H265eCtx *p;
  RK_S32 len_local;
  RK_U8 *buf_local;
  H265eSlice *slice_local;
  void *ctx_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_code_slice_skip_frame");
  }
  if ((buf == (RK_U8 *)0x0) || (len == 0)) {
    _mpp_log_l(2,"h265e_slice","buf or size no set",(char *)0x0);
    ctx_local._4_4_ = -1;
  }
  else {
    mpp_writer_init((MppWriteCtx *)&mb_h,buf,len);
    if (*(int *)((long)ctx + 0x4d3c) == 0) {
      bitIf.emul_cnt = 0;
      bitIf._44_4_ = *(int *)((long)ctx + 0x1654) + -1;
      h265e_code_skip_tile(ctx,slice,(MppWriteCtx *)&mb_h,(TileInfo *)&bitIf.emul_cnt);
    }
    else {
      bitIf.emul_cnt = 0;
      for (local_9c = 0; local_9c <= *(int *)((long)ctx + 0x4d3c); local_9c = local_9c + 1) {
        if (local_9c == *(int *)((long)ctx + 0x4d3c)) {
          iVar1 = *(int *)((long)ctx + 0x1654);
        }
        else {
          iVar1 = bitIf.emul_cnt +
                  *(int *)((long)ctx + (long)local_9c * 4 + 0x4d40) * *(int *)((long)ctx + 0x1664);
        }
        bitIf._44_4_ = iVar1 + -1;
        h265e_code_skip_tile(ctx,slice,(MppWriteCtx *)&mb_h,(TileInfo *)&bitIf.emul_cnt);
        bitIf.emul_cnt =
             *(int *)((long)ctx + (long)local_9c * 4 + 0x4d40) * *(int *)((long)ctx + 0x1664) +
             bitIf.emul_cnt;
      }
    }
    if ((h265e_debug & 1) != 0) {
      _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_skip_frame");
    }
    ctx_local._4_4_ = mpp_writer_bytes((MppWriteCtx *)&mb_h);
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 h265e_code_slice_skip_frame(void *ctx, H265eSlice *slice, RK_U8 *buf, RK_S32 len)
{
    H265eCtx *p = (H265eCtx *)ctx;
    H265eSps *sps = &p->sps;
    H265ePps *pps = &p->pps;
    TileInfo tile;
    MppWriteCtx bitIf;
    RK_U32 mb_wd;
    RK_U32 mb_h;
    RK_S32 i;

    h265e_dbg_func("enter\n");
    if (!buf || !len) {
        mpp_err("buf or size no set");
        return MPP_NOK;
    }

    mpp_writer_init(&bitIf, buf, len);
    tile.ctu_addr = 0;
    tile.tile_start_y = 0;
    tile.tile_end_y = sps->m_picHeightInLumaSamples - 1;

    if (pps->m_nNumTileColumnsMinus1) {
        tile.tile_start_x = 0;
        for (i = 0; i <= pps->m_nNumTileColumnsMinus1; i++) {
            tile.mb_total = pps->m_nTileColumnWidthArray[i] * pps->m_nTileRowHeightArray[i];
            if (i != pps->m_nNumTileColumnsMinus1)
                tile.tile_end_x = tile.tile_start_x +
                                  (pps->m_nTileColumnWidthArray[i] * sps->m_maxCUSize) - 1;
            else
                tile.tile_end_x = sps->m_picWidthInLumaSamples - 1;
            h265e_code_skip_tile(ctx, slice, &bitIf, &tile);
            tile.tile_start_x += (pps->m_nTileColumnWidthArray[i] * sps->m_maxCUSize);
            tile.ctu_addr += pps->m_nTileColumnWidthArray[i];
        }
    } else {
        mb_wd = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        mb_h = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        tile.mb_total = mb_wd * mb_h;
        tile.tile_start_x = 0;
        tile.tile_end_x = sps->m_picWidthInLumaSamples - 1;
        h265e_code_skip_tile(ctx, slice, &bitIf, &tile);
    }

    h265e_dbg_func("leave\n");
    return mpp_writer_bytes(&bitIf);
}